

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

bool __thiscall GGSock::Communicator::Data::doConnect(Data *this)

{
  TSocketDescriptor *sock;
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  byte unaff_R14B;
  int enable;
  timespec local_40;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  sock = &this->sd;
  do {
    if (this->isConnecting != true) {
      unaff_R14B = 0;
      break;
    }
    iVar2 = ::connect(*sock,(sockaddr *)&this->addr,0x10);
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if ((1 < iVar2 - 0x72U) && (iVar2 != 0xb)) {
        if (iVar2 == 0x6a) goto LAB_0010b1b1;
        anon_unknown.dwarf_783c::closeAndReset(sock);
        iVar2 = socket(2,1,6);
        *sock = iVar2;
        local_40.tv_sec = CONCAT44(local_40.tv_sec._4_4_,1);
        iVar2 = setsockopt(iVar2,1,2,&local_40,4);
        if (iVar2 < 0) {
          doConnect();
        }
        iVar2 = setsockopt(*sock,1,0xf,&local_40,4);
        if (iVar2 < 0) {
          doConnect();
        }
        anon_unknown.dwarf_783c::setNonBlocking(sock);
      }
      if (this->timeoutConnect_ms < 1) {
        unaff_R14B = 0;
        bVar1 = false;
      }
      else {
        local_40.tv_sec = 0;
        local_40.tv_nsec = 1000000;
        do {
          iVar2 = nanosleep(&local_40,&local_40);
          if (iVar2 != -1) break;
        } while (*piVar4 == 4);
        lVar5 = std::chrono::_V2::system_clock::now();
        bVar1 = true;
        if ((long)this->timeoutConnect_ms <= (lVar5 - lVar3) / 1000000) {
          anon_unknown.dwarf_783c::closeAndReset(sock);
          this->isConnecting = false;
        }
      }
    }
    else {
LAB_0010b1b1:
      this->sdpeer = this->sd;
      bVar1 = false;
      printf("Connected successfully, sd = %d\n");
      this->isConnected = true;
      this->isConnecting = false;
      unaff_R14B = 1;
    }
  } while (bVar1);
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool doConnect() {
            auto tStart = std::chrono::high_resolution_clock::now();

            while (isConnecting) {
                auto rc = ::connect(sd, (struct sockaddr *) &addr, sizeof(addr));
                if (rc < 0 && e_isConnected() == false) {
                    if (e_inProgress() == false && e_wouldBlock() == false) {
                        ::closeAndReset(sd);
                        sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

                        int enable = 1;
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
                        }

#ifndef _WIN32
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
                        }
#endif

                        //{
                        //    linger lin;
                        //    lin.l_onoff = 0;
                        //    lin.l_linger = 0;
                        //    if (setsockopt(sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
                        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
                        //    }
                        //}

                        ::setNonBlocking(sd);
                    }
                    if (timeoutConnect_ms > 0) {
                        std::this_thread::sleep_for(std::chrono::milliseconds(1));

                        auto tEnd = std::chrono::high_resolution_clock::now();
                        if (std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count() >= timeoutConnect_ms) {
                            ::closeAndReset(sd);
                            isConnecting = false;
                        }
                        continue;
                    }

                    return false;
                }

                sdpeer = sd;

                printf("Connected successfully, sd = %d\n", sd);

                isConnecting = false;
                isConnected = true;

                return true;
            }

            return false;
        }